

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O1

Ptr __thiscall r_comp::RepliMacro::expandMacro(RepliMacro *this,RepliStruct *oldStruct)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 *puVar3;
  string *psVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  __fn *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  long lVar11;
  void *in_R8;
  RepliStruct *__tmp;
  _Alloc_hider this_00;
  _Alloc_hider _Var12;
  Ptr PVar13;
  RepliStruct *__tmp_1;
  string *local_148;
  _Alloc_hider _Stack_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_130;
  _Alloc_hider local_120;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  
  if (*(long *)((long)&(oldStruct->cmd).field_2 + 8) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   "Macro \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_118);
    local_148 = (string *)&local_138;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      local_138 = *psVar9;
      aStack_130._M_allocated_capacity = plVar6[3];
    }
    else {
      local_138 = *psVar9;
      local_148 = (string *)*plVar6;
    }
    _Stack_140._M_p = (pointer)plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_148);
    _Var10._M_pi = extraout_RDX;
LAB_00120e79:
    if (local_148 != (string *)&local_138) {
      operator_delete(local_148);
      _Var10._M_pi = extraout_RDX_06;
    }
    paVar8 = &local_108;
  }
  else {
    if ((oldStruct->tail)._M_string_length == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     "Macro \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct)
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)local_118);
      local_148 = (string *)&local_138;
      psVar9 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar9) {
        local_138 = *psVar9;
        aStack_130._M_allocated_capacity = puVar7[3];
      }
      else {
        local_138 = *psVar9;
        local_148 = (string *)*puVar7;
      }
      _Stack_140._M_p = (pointer)puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_148);
      _Var10._M_pi = extraout_RDX_00;
      goto LAB_00120e79;
    }
    if (in_RDX == (__fn *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     "Macro \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct)
      ;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)local_118);
      local_148 = (string *)&local_138;
      psVar9 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar9) {
        local_138 = *psVar9;
        aStack_130._M_allocated_capacity = puVar7[3];
      }
      else {
        local_138 = *psVar9;
        local_148 = (string *)*puVar7;
      }
      _Stack_140._M_p = (pointer)puVar7[1];
      *puVar7 = psVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_148);
      _Var10._M_pi = extraout_RDX_05;
      goto LAB_00120e79;
    }
    iVar5 = std::__cxx11::string::compare((string *)(in_RDX + 8));
    if (iVar5 == 0) {
      lVar1 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
      lVar11 = *(long *)(lVar1 + 0xb0);
      lVar1 = *(long *)(lVar1 + 0xb8);
      __child_stack = (void *)(lVar1 - lVar11);
      if (__child_stack == (void *)0x0) {
        (this->name)._M_dataplus._M_p = (pointer)0x0;
        (this->name)._M_string_length = 0;
LAB_00120ebd:
        if (*(long *)(in_RDX + 0xb8) != *(long *)(in_RDX + 0xb0)) {
          RepliStruct::clone((RepliStruct *)&local_148,in_RDX,__child_stack,(int)lVar1,in_R8);
          _Var12._M_p = _Stack_140._M_p;
          psVar4 = local_148;
          local_148 = (string *)0x0;
          _Stack_140._M_p = (pointer)0x0;
          (this->name)._M_dataplus._M_p = (pointer)psVar4;
          p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->name)._M_string_length;
          (this->name)._M_string_length = (size_type)_Var12._M_p;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_140._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_140._M_p);
          }
          std::__cxx11::string::_M_assign((string *)&psVar4->_M_string_length);
          std::__cxx11::string::_M_assign((string *)&psVar4[2]._M_string_length);
          _Var10._M_pi = extraout_RDX_08;
          goto LAB_00120ea1;
        }
      }
      else {
        if (__child_stack != (void *)(*(long *)(in_RDX + 0xb8) - *(long *)(in_RDX + 0xb0))) {
          std::operator+(&local_50,"Macro \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         oldStruct);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar8) {
            local_c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_c0._8_8_ = plVar6[3];
            local_d0._M_allocated_capacity = (size_type)&local_c0;
          }
          else {
            local_c0._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_d0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar6;
          }
          local_d0._8_8_ = plVar6[1];
          *plVar6 = (long)paVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          lVar1 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
          std::__cxx11::to_string(&local_70,*(long *)(lVar1 + 0xb8) - *(long *)(lVar1 + 0xb0) >> 4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,&local_70);
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_b0._M_local_buf);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 == paVar8) {
            local_e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_e8._8_8_ = puVar7[3];
            local_f8._0_8_ = &local_e8;
          }
          else {
            local_e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
            local_f8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar7;
          }
          local_f8._8_8_ = puVar7[1];
          *puVar7 = paVar8;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::to_string
                    (&local_90,*(long *)(in_RDX + 0xb8) - *(long *)(in_RDX + 0xb0) >> 4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,&local_90);
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_118);
          psVar9 = puVar7 + 2;
          if ((size_type *)*puVar7 == psVar9) {
            local_138 = *psVar9;
            aStack_130._M_allocated_capacity = puVar7[3];
            local_148 = (string *)&local_138;
          }
          else {
            local_138 = *psVar9;
            local_148 = (string *)*puVar7;
          }
          _Stack_140._M_p = (pointer)puVar7[1];
          *puVar7 = psVar9;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_148);
          _Var10._M_pi = extraout_RDX_14;
          if (local_148 != (string *)&local_138) {
            operator_delete(local_148);
            _Var10._M_pi = extraout_RDX_15;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._0_8_ != &local_108) {
            operator_delete((void *)local_118._0_8_);
            _Var10._M_pi = extraout_RDX_16;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_17;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._0_8_ != &local_e8) {
            operator_delete((void *)local_f8._0_8_);
            _Var10._M_pi = extraout_RDX_18;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_allocated_capacity != &local_a0) {
            operator_delete((void *)local_b0._M_allocated_capacity);
            _Var10._M_pi = extraout_RDX_19;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
            _Var10._M_pi = extraout_RDX_20;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_allocated_capacity != &local_c0) {
            operator_delete((void *)local_d0._M_allocated_capacity);
            _Var10._M_pi = extraout_RDX_21;
          }
          paVar8 = &local_50.field_2;
          goto LAB_00120e8c;
        }
        (this->name)._M_dataplus._M_p = (pointer)0x0;
        (this->name)._M_string_length = 0;
        if (lVar1 == lVar11) goto LAB_00120ebd;
      }
      local_120._M_p = (pointer)this;
      RepliStruct::clone((RepliStruct *)&local_148,(__fn *)(oldStruct->tail)._M_string_length,
                         __child_stack,(int)lVar1,in_R8);
      _Var12._M_p = _Stack_140._M_p;
      local_d8 = local_148;
      local_148 = (string *)0x0;
      _Stack_140._M_p = (pointer)0x0;
      (this->name)._M_dataplus._M_p = (pointer)local_d8;
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->name)._M_string_length;
      (this->name)._M_string_length = (size_type)_Var12._M_p;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_140._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_140._M_p);
      }
      std::__cxx11::string::_M_assign((string *)&local_d8[2]._M_string_length);
      lVar1 = *(long *)((long)&(oldStruct->cmd).field_2 + 8);
      lVar11 = *(long *)(lVar1 + 0xb0);
      lVar1 = *(long *)(lVar1 + 0xb8);
      if (lVar11 == lVar1) {
        _Var12._M_p = (pointer)0x0;
        _Var10._M_pi = extraout_RDX_09;
      }
      else {
        puVar7 = *(undefined8 **)(in_RDX + 0xb0);
        this_00._M_p = (pointer)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        do {
          PVar13 = RepliStruct::findAtom((RepliStruct *)&local_148,local_d8);
          _Var12._M_p = _Stack_140._M_p;
          psVar4 = local_148;
          _Var10 = PVar13.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          local_148 = (string *)0x0;
          _Stack_140._M_p = (pointer)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_p);
            _Var10._M_pi = extraout_RDX_10;
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_140._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_140._M_p);
            _Var10._M_pi = extraout_RDX_11;
          }
          if (psVar4 != (string *)0x0) {
            puVar3 = (undefined4 *)*puVar7;
            *(undefined4 *)psVar4 = *puVar3;
            std::__cxx11::string::_M_assign((string *)((long)psVar4 + 8));
            std::__cxx11::string::_M_assign((string *)((long)psVar4 + 0x28));
            std::__cxx11::string::_M_assign((string *)((long)psVar4 + 0x48));
            std::__cxx11::string::_M_assign((string *)((long)psVar4 + 0x68));
            std::__cxx11::string::_M_assign((string *)((long)psVar4 + 0x88));
            *(undefined8 *)((long)psVar4 + 0xa8) = *(undefined8 *)(puVar3 + 0x2a);
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::operator=((vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                         *)((long)psVar4 + 0xb0),
                        (vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                         *)(puVar3 + 0x2c));
            *(undefined8 *)((long)psVar4 + 200) = *(undefined8 *)(puVar3 + 0x32);
            _Var10._M_pi = extraout_RDX_12;
          }
          lVar11 = lVar11 + 0x10;
          puVar7 = puVar7 + 2;
          this_00._M_p = _Var12._M_p;
        } while (lVar11 != lVar1);
      }
      this = (RepliMacro *)local_120._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var12._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var12._M_p);
        _Var10._M_pi = extraout_RDX_13;
      }
      goto LAB_00120ea1;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   "Macro \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)oldStruct);
    plVar6 = (long *)std::__cxx11::string::append(local_b0._M_local_buf);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_e8._8_8_ = plVar6[3];
      local_f8._0_8_ = &local_e8;
    }
    else {
      local_e8._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_f8._8_8_ = plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append(local_f8,*(ulong *)(in_RDX + 8));
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar8) {
      local_108._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_108._8_8_ = plVar6[3];
      local_118._0_8_ = &local_108;
    }
    else {
      local_108._M_allocated_capacity = paVar8->_M_allocated_capacity;
      local_118._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_118._8_8_ = plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_118);
    psVar9 = puVar7 + 2;
    if ((size_type *)*puVar7 == psVar9) {
      local_138 = *psVar9;
      aStack_130._M_allocated_capacity = puVar7[3];
      local_148 = (string *)&local_138;
    }
    else {
      local_138 = *psVar9;
      local_148 = (string *)*puVar7;
    }
    _Stack_140._M_p = (pointer)puVar7[1];
    *puVar7 = psVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::_M_append((oldStruct->tail).field_2._M_local_buf + 8,(ulong)local_148);
    _Var10._M_pi = extraout_RDX_01;
    if (local_148 != (string *)&local_138) {
      operator_delete(local_148);
      _Var10._M_pi = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._0_8_ != &local_108) {
      operator_delete((void *)local_118._0_8_);
      _Var10._M_pi = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._0_8_ != &local_e8) {
      operator_delete((void *)local_f8._0_8_);
      _Var10._M_pi = extraout_RDX_04;
    }
    paVar8 = &local_a0;
  }
LAB_00120e8c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar8->_M_allocated_capacity)[-2] != paVar8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar8->_M_allocated_capacity)[-2]);
    _Var10._M_pi = extraout_RDX_07;
  }
  (this->name)._M_dataplus._M_p = (pointer)0x0;
  (this->name)._M_string_length = 0;
LAB_00120ea1:
  PVar13.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  PVar13.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar13.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

RepliStruct::Ptr RepliMacro::expandMacro(RepliStruct *oldStruct)
{
    if (src == nullptr) {
        error += "Macro '" + name + "' source not defined. ";
        return nullptr;
    }

    if (dest == nullptr) {
        error += "Macro '" + name + "' destination not defined. ";
        return nullptr;
    }

    if (oldStruct == nullptr) {
        error += "Macro '" + name + "' cannot expand empty structure. ";
        return nullptr;
    }

    if (oldStruct->cmd.compare(this->name) != 0) {
        error += "Macro '" + name + "' cannot expand structure with different name '" + oldStruct->cmd + "'. ";
        return nullptr;
    }

    if ((src->args.size() > 0) && (src->args.size() != oldStruct->args.size())) {
        error += "Macro '" + name + "' requires " + std::to_string(src->args.size()) + " arguments, cannot expand structure with " + std::to_string(oldStruct->args.size()) + " arguments. ";
        return nullptr;
    }

    RepliStruct::Ptr newStruct;

    // Special case of macros without args, just copy in the args from oldStruct
    if ((src->args.size() == 0) && (oldStruct->args.size() > 0)) {
        newStruct = oldStruct->clone();
        newStruct->cmd = dest->cmd;
        newStruct->label = oldStruct->label;
        return newStruct;
    } else {
        newStruct = dest->clone();
        newStruct->label = oldStruct->label;
    }

    RepliStruct::Ptr findStruct;
    std::vector<RepliStruct::Ptr>::const_iterator iOld(oldStruct->args.begin());

    for (std::vector<RepliStruct::Ptr>::const_iterator iSrc(src->args.begin()), iSrcEnd(src->args.end()); iSrc != iSrcEnd; ++iSrc, ++iOld) {
        // printf("looking for '%s'\n", (*iSrc)->cmd.c_str());
        // find the Atom inside newStruct with the name of iSrc->cmd
        findStruct = newStruct->findAtom((*iSrc)->cmd);

        if (findStruct != nullptr) {
            // overwrite data in findStruct with the matching one from old
            *findStruct = *(*iOld);
        }
    }

    return newStruct;
}